

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

shared_ptr<pbrt::Film> __thiscall
pbrt::BinaryReader::getEntity<pbrt::Film>(BinaryReader *this,int ID)

{
  long lVar1;
  long lVar2;
  pointer puVar3;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined4 in_register_00000034;
  long lVar4;
  undefined1 auVar5 [16];
  shared_ptr<pbrt::Film> sVar6;
  
  if ((int)in_RDX._M_pi != -1) {
    lVar1 = *(long *)(CONCAT44(in_register_00000034,ID) + 0x20);
    lVar4 = (long)(int)in_RDX._M_pi * 0x10;
    lVar2 = *(long *)(lVar1 + lVar4);
    if (lVar2 != 0) {
      auVar5 = __dynamic_cast(lVar2,&Entity::typeinfo,&Film::typeinfo,0);
      in_RDX._M_pi = auVar5._8_8_;
      if (auVar5._0_8_ == (pointer)0x0) {
        (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_001205f8:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"error in reading binary file - given entity is not of expected type!");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = auVar5._0_8_;
      puVar3 = *(pointer *)(lVar1 + lVar4 + 8);
      (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar3;
      if (puVar3 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(puVar3 + 8) = *(int *)(puVar3 + 8) + 1;
          UNLOCK();
          if ((this->currentEntityData).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_001205f8;
        }
        else {
          *(int *)(puVar3 + 8) = *(int *)(puVar3 + 8) + 1;
        }
      }
      goto LAB_001205dd;
    }
  }
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_001205dd:
  sVar6.super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar6.super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<pbrt::Film>)sVar6.super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> getEntity(int ID)
    {
      // rule 1: ID -1 is a valid identifier for 'null object'
      if (ID == -1)
        return std::shared_ptr<T>();
      // assertion: only values with ID 0 ... N-1 are allowed
      assert(ID < (int)readEntities.size() && ID >= 0);

      // rule 2: if object _was_ a null pointer, return it (that was
      // an error during object creation)
      if (!readEntities[ID])
        return std::shared_ptr<T>();

      std::shared_ptr<T> t = std::dynamic_pointer_cast<T>(readEntities[ID]);
      
      // rule 3: if object was of different type, throw an exception
      if (!t)
        throw std::runtime_error("error in reading binary file - given entity is not of expected type!");

      // rule 4: otherwise, return object cast to that type
      return t;
    }